

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
CompactSizeFormatter<true>::Unser<DataStream,unsigned_short>
          (CompactSizeFormatter<true> *this,DataStream *s,unsigned_short *v)

{
  long lVar1;
  unsigned_short uVar2;
  uint64_t uVar3;
  error_code *this_00;
  undefined2 *in_RDX;
  long in_FS_OFFSET;
  bool in_stack_00000017;
  DataStream *in_stack_00000018;
  uint64_t n;
  error_code *peVar4;
  undefined2 local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = ReadCompactSize<DataStream>(in_stack_00000018,in_stack_00000017);
  uVar2 = std::numeric_limits<unsigned_short>::min();
  if (uVar2 <= uVar3) {
    uVar2 = std::numeric_limits<unsigned_short>::max();
    if (uVar3 <= uVar2) {
      local_38 = (undefined2)uVar3;
      *in_RDX = local_38;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_004492a2;
    }
  }
  this_00 = (error_code *)__cxa_allocate_exception(0x20);
  peVar4 = this_00;
  std::error_code::error_code<std::io_errc,void>(this_00,(io_errc)((ulong)this_00 >> 0x20));
  std::ios_base::failure[abi:cxx11]::failure
            ((char *)peVar4,(error_code *)"CompactSize exceeds limit of type");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(this_00,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
LAB_004492a2:
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, I& v)
    {
        uint64_t n = ReadCompactSize<Stream>(s, RangeCheck);
        if (n < std::numeric_limits<I>::min() || n > std::numeric_limits<I>::max()) {
            throw std::ios_base::failure("CompactSize exceeds limit of type");
        }
        v = n;
    }